

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.h
# Opt level: O2

shared_ptr<chrono::ChNodeBase> __thiscall
chrono::fea::ChMatterMeshless::GetNode(ChMatterMeshless *this,uint n)

{
  long lVar1;
  ulong in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<chrono::ChNodeBase> sVar2;
  
  lVar1 = *(long *)(CONCAT44(in_register_00000034,n) + 0x78);
  if ((in_RDX & 0xffffffff) <
      (ulong)(*(long *)(CONCAT44(in_register_00000034,n) + 0x80) - lVar1 >> 4)) {
    std::__shared_ptr<chrono::ChNodeBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChNodeMeshless,void>
              ((__shared_ptr<chrono::ChNodeBase,(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2> *)
               (lVar1 + (in_RDX & 0xffffffff) * 0x10));
    sVar2.super___shared_ptr<chrono::ChNodeBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<chrono::ChNodeBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<chrono::ChNodeBase>)
           sVar2.super___shared_ptr<chrono::ChNodeBase,_(__gnu_cxx::_Lock_policy)2>;
  }
  __assert_fail("n < nodes.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChMatterMeshless.h"
                ,0xe8,
                "virtual std::shared_ptr<ChNodeBase> chrono::fea::ChMatterMeshless::GetNode(unsigned int)"
               );
}

Assistant:

virtual std::shared_ptr<ChNodeBase> GetNode(unsigned int n) override {
        assert(n < nodes.size());
        return nodes[n];
    }